

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

ValueType __thiscall wabt::interp::FuncDesc::GetLocalType(FuncDesc *this,Index index)

{
  pointer pTVar1;
  pointer pLVar2;
  pointer pLVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pTVar1 = (this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2;
  if (index < uVar4) {
    pLVar3 = (pointer)(pTVar1 + index);
  }
  else {
    pLVar3 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)pLVar2 - (long)pLVar3;
    if (0 < (long)uVar7) {
      uVar7 = (uVar7 >> 2) * -0x5555555555555555;
      do {
        uVar5 = uVar7 >> 1;
        uVar6 = uVar5;
        if (pLVar3[uVar5].end < (index - (int)uVar4) + 1) {
          uVar6 = ~uVar5 + uVar7;
          pLVar3 = pLVar3 + uVar5 + 1;
        }
        uVar7 = uVar6;
      } while (0 < (long)uVar6);
    }
    if (pLVar3 == pLVar2) {
      __assert_fail("iter != locals.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                    ,0xbf,"ValueType wabt::interp::FuncDesc::GetLocalType(Index) const");
    }
  }
  return (ValueType)(pLVar3->type).enum_;
}

Assistant:

ValueType FuncDesc::GetLocalType(Index index) const {
  if (index < type.params.size()) {
    return type.params[index];
  }
  index -= type.params.size();

  auto iter = std::lower_bound(
      locals.begin(), locals.end(), index + 1,
      [](const LocalDesc& lhs, Index rhs) { return lhs.end < rhs; });
  assert(iter != locals.end());
  return iter->type;
}